

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack.hpp
# Opt level: O2

packer<msgpack::v1::sbuffer> * __thiscall
msgpack::v1::packer<msgpack::v1::sbuffer>::pack_str(packer<msgpack::v1::sbuffer> *this,uint32_t l)

{
  char *buf_00;
  size_t sStack_20;
  char buf;
  char buf_1 [2];
  char buf_2 [3];
  char buf_3 [5];
  
  if (l < 0x20) {
    buf = (byte)l | 0xa0;
    buf_00 = &buf;
    sStack_20 = 1;
  }
  else if (l < 0x100) {
    buf_00 = buf_1;
    buf_1[0] = -0x27;
    sStack_20 = 2;
    buf_1[1] = (byte)l;
  }
  else if (l < 0x10000) {
    buf_00 = buf_2;
    buf_2[0] = -0x26;
    buf_2._1_2_ = (ushort)l << 8 | (ushort)l >> 8;
    sStack_20 = 3;
  }
  else {
    buf_00 = buf_3;
    buf_3[0] = -0x25;
    buf_3._1_4_ = l >> 0x18 | (l & 0xff0000) >> 8 | (l & 0xff00) << 8 | l << 0x18;
    sStack_20 = 5;
  }
  append_buffer(this,buf_00,sStack_20);
  return this;
}

Assistant:

inline packer<Stream>& packer<Stream>::pack_str(uint32_t l)
{
    if(l < 32) {
        unsigned char d = static_cast<uint8_t>(0xa0u | l);
        char buf = take8_8(d);
        append_buffer(&buf, 1);
    } else if(l < 256) {
        char buf[2];
        buf[0] = static_cast<char>(0xd9u); buf[1] = static_cast<char>(l);
        append_buffer(buf, 2);
    } else if(l < 65536) {
        char buf[3];
        buf[0] = static_cast<char>(0xdau); _msgpack_store16(&buf[1], static_cast<uint16_t>(l));
        append_buffer(buf, 3);
    } else {
        char buf[5];
        buf[0] = static_cast<char>(0xdbu); _msgpack_store32(&buf[1], static_cast<uint32_t>(l));
        append_buffer(buf, 5);
    }
    return *this;
}